

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O1

void so_5::impl::msg_tracing_helpers::details::
     make_trace<so_5::agent_t*const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::impl::msg_tracing_helpers::details::mbox_identification,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::state_t_const*,so_5::impl::event_handler_data_t_const*&>
               (tracer_t *tracer,agent_t **args,composed_action_name *args_1,
               mbox_identification *args_2,type_index *args_3,
               intrusive_ptr_t<so_5::message_t> *args_4,state_t **args_5,
               event_handler_data_t **args_6)

{
  pthread_t pVar1;
  ostream *poVar2;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream s;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar2 = (ostream *)&s;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[tid=",5);
  pVar1 = pthread_self();
  if (pVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  make_trace_to<so_5::agent_t*const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::impl::msg_tracing_helpers::details::mbox_identification,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::state_t_const*,so_5::impl::event_handler_data_t_const*&>
            ((ostream *)&s,args,args_1,args_2,args_3,args_4,args_5,args_6);
  std::__cxx11::stringbuf::str();
  (*tracer->_vptr_tracer_t[2])(tracer,local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
make_trace(
	so_5::msg_tracing::tracer_t & tracer,
	ARGS &&... args ) SO_5_NOEXCEPT
	{
#if !defined( SO_5_HAVE_NOEXCEPT )
		so_5::details::invoke_noexcept_code( [&] {
#endif
				std::ostringstream s;

				s << "[tid=" << query_current_thread_id() << "]";

				make_trace_to( s, std::forward< ARGS >(args)... );

				tracer.trace( s.str() );
#if !defined( SO_5_HAVE_NOEXCEPT )
			} );
#endif
	}